

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::basicFeasibilityChangePrice(HEkkPrimal *this)

{
  HVector *vector;
  HighsInt *pHVar1;
  HVector *this_00;
  uint uVar2;
  pointer pcVar3;
  pointer pdVar4;
  bool bVar5;
  ulong uVar6;
  HighsSparseMatrix *this_01;
  HEkk *pHVar7;
  HighsSimplexAnalysis *pHVar8;
  bool use_col_price;
  bool use_row_price_w_switch;
  bool local_2a;
  bool local_29;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x40,0);
  pHVar7 = this->ekk_instance_;
  vector = &this->col_basic_feasibility_change;
  HEkk::choosePriceTechnique
            (pHVar7,(pHVar7->info_).price_strategy,
             (double)(this->col_basic_feasibility_change).count / (double)this->num_row,&local_2a,
             &local_29);
  bVar5 = local_29;
  pHVar8 = this->analysis;
  if (pHVar8->analyse_simplex_summary_data == true) {
    if (local_2a == true) {
      HighsSimplexAnalysis::operationRecordBefore(pHVar8,3,vector,1.0);
      pHVar1 = &this->analysis->num_col_price;
      *pHVar1 = *pHVar1 + 1;
    }
    else {
      HighsSimplexAnalysis::operationRecordBefore
                (pHVar8,3,vector,(this->ekk_instance_->info_).col_basic_feasibility_change_density);
      if (bVar5 == true) {
        pHVar1 = &this->analysis->num_row_price_with_switch;
        *pHVar1 = *pHVar1 + 1;
      }
      else {
        pHVar1 = &this->analysis->num_row_price;
        *pHVar1 = *pHVar1 + 1;
      }
    }
  }
  this_00 = &this->row_basic_feasibility_change;
  HVectorBase<double>::clear(this_00);
  if (local_2a == true) {
    HighsSparseMatrix::priceByColumn(&(this->ekk_instance_->lp_).a_matrix_,false,this_00,vector,-2);
  }
  else {
    this_01 = &this->ekk_instance_->ar_matrix_;
    if (local_29 == true) {
      HighsSparseMatrix::priceByRowWithSwitch
                (this_01,false,this_00,vector,(pHVar7->info_).row_basic_feasibility_change_density,0
                 ,0.1,-2);
    }
    else {
      HighsSparseMatrix::priceByRow(this_01,false,this_00,vector,-2);
    }
  }
  uVar2 = this->num_col;
  if (local_2a == false) {
    pHVar7 = this->ekk_instance_;
  }
  else {
    pHVar7 = this->ekk_instance_;
    if (0 < (int)uVar2) {
      pcVar3 = (pHVar7->basis_).nonbasicFlag_.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->row_basic_feasibility_change).array.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar6 = 0;
      do {
        pdVar4[uVar6] = (double)(int)pcVar3[uVar6] * pdVar4[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
  }
  HEkk::updateOperationResultDensity
            (pHVar7,(double)(this->row_basic_feasibility_change).count / (double)(int)uVar2,
             &(pHVar7->info_).row_basic_feasibility_change_density);
  pHVar8 = this->analysis;
  if (pHVar8->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordAfter(pHVar8,3,this_00);
    pHVar8 = this->analysis;
  }
  HighsSimplexAnalysis::simplexTimerStop(pHVar8,0x40,0);
  return;
}

Assistant:

void HEkkPrimal::basicFeasibilityChangePrice() {
  analysis->simplexTimerStart(PriceBasicFeasibilityChangeClock);
  const HighsSimplexInfo& info = ekk_instance_.info_;
  const double local_density =
      1.0 * col_basic_feasibility_change.count / num_row;
  bool use_col_price;
  bool use_row_price_w_switch;
  ekk_instance_.choosePriceTechnique(info.price_strategy, local_density,
                                     use_col_price, use_row_price_w_switch);
  if (analysis->analyse_simplex_summary_data) {
    if (use_col_price) {
      const double expected_density = 1;
      analysis->operationRecordBefore(kSimplexNlaPriceBasicFeasibilityChange,
                                      col_basic_feasibility_change,
                                      expected_density);
      analysis->num_col_price++;
    } else if (use_row_price_w_switch) {
      analysis->operationRecordBefore(
          kSimplexNlaPriceBasicFeasibilityChange, col_basic_feasibility_change,
          ekk_instance_.info_.col_basic_feasibility_change_density);
      analysis->num_row_price_with_switch++;
    } else {
      analysis->operationRecordBefore(
          kSimplexNlaPriceBasicFeasibilityChange, col_basic_feasibility_change,
          ekk_instance_.info_.col_basic_feasibility_change_density);
      analysis->num_row_price++;
    }
  }
  row_basic_feasibility_change.clear();
  const bool quad_precision = false;
  if (use_col_price) {
    // Perform column-wise PRICE
    ekk_instance_.lp_.a_matrix_.priceByColumn(quad_precision,
                                              row_basic_feasibility_change,
                                              col_basic_feasibility_change);
  } else if (use_row_price_w_switch) {
    // Perform hyper-sparse row-wise PRICE, but switch if the density of
    // row_basic_feasibility_change becomes extreme
    //
    const double switch_density = kHyperPriceDensity;
    ekk_instance_.ar_matrix_.priceByRowWithSwitch(
        quad_precision, row_basic_feasibility_change,
        col_basic_feasibility_change, info.row_basic_feasibility_change_density,
        0, switch_density);
  } else {
    // Perform hyper-sparse row-wise PRICE
    ekk_instance_.ar_matrix_.priceByRow(quad_precision,
                                        row_basic_feasibility_change,
                                        col_basic_feasibility_change);
  }
  if (use_col_price) {
    // Column-wise PRICE computes components corresponding to basic
    // variables, so zero these by exploiting the fact that, for basic
    // variables, nonbasicFlag[*]=0
    const std::vector<int8_t>& nonbasicFlag =
        ekk_instance_.basis_.nonbasicFlag_;
    for (HighsInt iCol = 0; iCol < num_col; iCol++)
      row_basic_feasibility_change.array[iCol] *= nonbasicFlag[iCol];
  }
  // Update the record of average row_basic_feasibility_change density
  const double local_row_basic_feasibility_change_density =
      (double)row_basic_feasibility_change.count / num_col;
  ekk_instance_.updateOperationResultDensity(
      local_row_basic_feasibility_change_density,
      ekk_instance_.info_.row_basic_feasibility_change_density);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaPriceBasicFeasibilityChange,
                                   row_basic_feasibility_change);
  analysis->simplexTimerStop(PriceBasicFeasibilityChangeClock);
}